

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

double __thiscall FixedSizeCache<double>::max(FixedSizeCache<double> *this)

{
  pointer pdVar1;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  runtime_error *this_00;
  
  if ((long)this->_count != 0) {
    pdVar1 = (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (pdVar1,pdVar1 + this->_count);
    return *_Var2._M_current;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FixedSizeCache::max() called on empty cache");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }